

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# video_writer.c
# Opt level: O3

void aom_video_writer_close(AvxVideoWriter *writer)

{
  aom_codec_enc_cfg local_390;
  
  if (writer != (AvxVideoWriter *)0x0) {
    rewind((FILE *)writer->file);
    local_390.g_w = (writer->info).frame_width;
    local_390.g_h = (writer->info).frame_height;
    local_390.g_timebase.num = (writer->info).time_base.numerator;
    local_390.g_timebase.den = (writer->info).time_base.denominator;
    ivf_write_file_header(writer->file,&local_390,(writer->info).codec_fourcc,writer->frame_count);
    fclose((FILE *)writer->file);
    free(writer);
  }
  return;
}

Assistant:

void aom_video_writer_close(AvxVideoWriter *writer) {
  if (writer) {
    // Rewriting frame header with real frame count
    rewind(writer->file);
    write_header(writer->file, &writer->info, writer->frame_count);

    fclose(writer->file);
    free(writer);
  }
}